

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CamCal.cpp
# Opt level: O2

void __thiscall CCamCal::CCamCal(CCamCal *this)

{
  _Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_30;
  
  CCfg::CCfg(&this->m_oCfg);
  cv::Mat::Mat(&this->m_oImgFrm);
  (this->m_vo2dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vo2dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vo3dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vo2dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vo3dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vo3dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cv::Mat::Mat(&this->m_oHomoMat);
  local_30._M_impl.super__Vector_impl_data._M_start =
       (this->m_vo3dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_30._M_impl.super__Vector_impl_data._M_finish =
       (this->m_vo3dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_30._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_vo3dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_vo3dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vo3dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vo3dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&local_30);
  local_30._M_impl.super__Vector_impl_data._M_start =
       (this->m_vo2dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_30._M_impl.super__Vector_impl_data._M_finish =
       (this->m_vo2dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_30._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_vo2dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_vo2dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vo2dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vo2dPt).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&local_30);
  return;
}

Assistant:

CCamCal::CCamCal(void)
{
	// list of 3D points for PnP
	std::vector<cv::Point2f>().swap(m_vo3dPt);

	// list of 2D points for PnP
	std::vector<cv::Point2f>().swap(m_vo2dPt);
}